

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_S2C_RESPONSE(void)

{
  uint uVar1;
  undefined1 local_258 [4];
  uint32_t newlen;
  PipeMsg newmsg;
  undefined1 local_130 [4];
  uint32_t len;
  PipeMsg msg;
  uint8_t *buf;
  
  msg.field_1._272_8_ = operator_new__(0x40000);
  MsgHelper::initMsg((PipeMsg *)local_130,S2C_RESPONSE);
  msg.type = S2C_RESPONSE;
  newmsg.field_1._276_4_ =
       MsgHelper::serializeMsg((PipeMsg *)local_130,(uint8_t *)msg.field_1._272_8_);
  printHex((uchar *)msg.field_1._272_8_,newmsg.field_1._276_4_);
  uVar1 = MsgHelper::deserializeMsg((uint8_t *)msg.field_1._272_8_,0x40000,(PipeMsg *)local_258);
  printf("len = %d, newlen = %d\n",(ulong)(uint)newmsg.field_1._276_4_,(ulong)uVar1);
  if (uVar1 == newmsg.field_1._276_4_) {
    MsgHelper::printMsg((PipeMsg *)local_130);
    MsgHelper::printMsg((PipeMsg *)local_258);
    MsgHelper::destroyMsg((PipeMsg *)local_130);
    MsgHelper::destroyMsg((PipeMsg *)local_258);
    if (msg.field_1._272_8_ != 0) {
      operator_delete__((void *)msg.field_1._272_8_);
    }
    return;
  }
  __assert_fail("newlen == len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0xab,"void test_S2C_RESPONSE()");
}

Assistant:

void test_S2C_RESPONSE()
{
	uint8_t *buf = new uint8_t[MSG_MAX_SIZE];
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::S2C_RESPONSE);
	msg.s2c_response.CODE = S2C_RESPONSE_CODE::TCP_TIME_OUT;
	
	uint32_t len = MsgHelper::serializeMsg(&msg, buf);
	printHex(buf, len);
	
	PipeMsg newmsg;
	uint32_t newlen = MsgHelper::deserializeMsg(buf, MSG_MAX_SIZE, &newmsg);

	printf("len = %d, newlen = %d\n", len, newlen);
	assert(newlen == len);
	
	
	MsgHelper::printMsg(&msg);
	MsgHelper::printMsg(&newmsg);	
	MsgHelper::destroyMsg(&msg);
	MsgHelper::destroyMsg(&newmsg);
	
	delete[]buf;
}